

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(MXNetNode *this,int i,int init_len)

{
  vector<MXNetNode,_std::allocator<MXNetNode>_> *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference this_01;
  ulong uVar4;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  MXNetParam *p;
  int i_1;
  string *name;
  vector<float,_std::allocator<float>_> *data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  int iVar5;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  vector<float,_std::allocator<float>_> *__x;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  int local_24;
  
  __x = in_RDI;
  if ((in_EDX < 0) ||
     (iVar6 = in_EDX,
     sVar2 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x16)), (int)sVar2 <= iVar6))
  {
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x106ec9);
  }
  else {
    this_00 = (vector<MXNetNode,_std::allocator<MXNetNode>_> *)*in_RSI;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x16),(long)in_EDX);
    std::vector<MXNetNode,_std::allocator<MXNetNode>_>::operator[](this_00,(long)*pvVar3);
    local_24 = 0;
    while (iVar5 = local_24,
          sVar2 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::size
                            ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RSI[1]),
          iVar5 < (int)sVar2) {
      this_01 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::operator[]
                          ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RSI[1],
                           (long)local_24);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(iVar5,CONCAT13(in_stack_ffffffffffffff83,
                                                      CONCAT12(in_stack_ffffffffffffff82,
                                                               in_stack_ffffffffffffff80))),
                              in_stack_ffffffffffffff78);
      if (!bVar1) {
        bVar1 = std::vector<float,_std::allocator<float>_>::empty
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(iVar6,in_stack_ffffffffffffff90));
        if (!bVar1) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)this_01,
                     (vector<float,_std::allocator<float>_> *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
          return __x;
        }
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)0x106f9a);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          return __x;
        }
        if (in_ECX == 0) {
          return __x;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(iVar5,CONCAT13(in_stack_ffffffffffffff83,
                                                         CONCAT12(in_stack_ffffffffffffff82,
                                                                  in_stack_ffffffffffffff80))),
                                (char *)in_stack_ffffffffffffff78);
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(iVar5,CONCAT13(bVar1,CONCAT12(
                                                  in_stack_ffffffffffffff82,
                                                  in_stack_ffffffffffffff80))),
                                  (char *)in_stack_ffffffffffffff78);
          if (!bVar1) {
            return __x;
          }
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(0x3f800000,in_stack_ffffffffffffffb0),(size_type)in_RSI,
                     (value_type_conflict2 *)__x);
          return __x;
        }
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)in_RSI,
                   (value_type_conflict2 *)__x);
        return __x;
      }
      local_24 = local_24 + 1;
    }
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x1070a9);
  }
  return __x;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& name = (*nodes)[ weights[i] ].name;

    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name != name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}